

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_message(parser *p)

{
  int iVar1;
  byte *pbVar2;
  char *name;
  char *__s;
  size_t sVar3;
  prefs_data *d;
  char *type;
  char *attr;
  wchar_t msg_index;
  wchar_t a;
  parser *p_local;
  
  pbVar2 = (byte *)parser_priv(p);
  if (pbVar2 != (byte *)0x0) {
    if ((*pbVar2 & 1) == 0) {
      name = parser_getsym(p,"type");
      __s = parser_getsym(p,"attr");
      iVar1 = message_lookup_by_name(name);
      if (iVar1 < 0) {
        p_local._4_4_ = PARSE_ERROR_INVALID_MESSAGE;
      }
      else {
        sVar3 = strlen(__s);
        if (sVar3 < 2) {
          attr._4_4_ = color_char_to_attr(*__s);
        }
        else {
          attr._4_4_ = color_text_to_attr(__s);
        }
        if (attr._4_4_ < 0) {
          p_local._4_4_ = PARSE_ERROR_INVALID_COLOR;
        }
        else {
          message_color_define((uint16_t)iVar1,(uint8_t)attr._4_4_);
          p_local._4_4_ = PARSE_ERROR_NONE;
        }
      }
    }
    else {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x3dc,"enum parser_error parse_prefs_message(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_message(struct parser *p)
{
	int a, msg_index;
	const char *attr;
	const char *type;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	type = parser_getsym(p, "type");
	attr = parser_getsym(p, "attr");

	msg_index = message_lookup_by_name(type);

	if (msg_index < 0)
		return PARSE_ERROR_INVALID_MESSAGE;

	if (strlen(attr) > 1)
		a = color_text_to_attr(attr);
	else
		a = color_char_to_attr(attr[0]);

	if (a < 0)
		return PARSE_ERROR_INVALID_COLOR;

	message_color_define(msg_index, (uint8_t)a);

	return PARSE_ERROR_NONE;
}